

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatSolver.c
# Opt level: O2

void xSAT_SolverGarbageCollect(xSAT_Solver_t *s)

{
  xSAT_Mem_t *pxVar1;
  int *piVar2;
  int iVar3;
  xSAT_Mem_t *p;
  xSAT_WatchList_t *pxVar4;
  Vec_Int_t *pVVar5;
  uint uVar6;
  int iVar7;
  uint nCap;
  long lVar8;
  xSAT_Watcher_t *pxVar9;
  uint *puVar10;
  
  uVar6 = s->pMemory->nCap - s->pMemory->nWasted;
  p = (xSAT_Mem_t *)calloc(1,0x18);
  nCap = 0x100000;
  if (0 < (int)uVar6) {
    nCap = uVar6;
  }
  xSAT_MemGrow(p,nCap);
  for (iVar7 = 0; iVar7 < s->vAssigns->nSize * 2; iVar7 = iVar7 + 1) {
    pxVar4 = xSAT_VecWatchListEntry(s->vWatches,iVar7);
    pxVar9 = pxVar4->pArray;
    for (lVar8 = (long)pxVar4->nSize << 3; lVar8 != 0; lVar8 = lVar8 + -8) {
      xSAT_SolverClaRealloc(p,s->pMemory,&pxVar9->CRef);
      pxVar9 = pxVar9 + 1;
    }
    pxVar4 = xSAT_VecWatchListEntry(s->vBinWatches,iVar7);
    pxVar9 = pxVar4->pArray;
    for (lVar8 = (long)pxVar4->nSize << 3; lVar8 != 0; lVar8 = lVar8 + -8) {
      xSAT_SolverClaRealloc(p,s->pMemory,&pxVar9->CRef);
      pxVar9 = pxVar9 + 1;
    }
  }
  for (iVar7 = 0; iVar7 < s->vTrail->nSize; iVar7 = iVar7 + 1) {
    pVVar5 = s->vReasons;
    iVar3 = Vec_IntEntry(s->vTrail,iVar7);
    iVar3 = Vec_IntEntry(pVVar5,iVar3 >> 1);
    if (iVar3 != -1) {
      pxVar1 = s->pMemory;
      piVar2 = s->vReasons->pArray;
      iVar3 = Vec_IntEntry(s->vTrail,iVar7);
      xSAT_SolverClaRealloc(p,pxVar1,(uint *)(piVar2 + (iVar3 >> 1)));
    }
  }
  pVVar5 = s->vLearnts;
  puVar10 = (uint *)pVVar5->pArray;
  for (lVar8 = 0; lVar8 < pVVar5->nSize; lVar8 = lVar8 + 1) {
    xSAT_SolverClaRealloc(p,s->pMemory,puVar10);
    pVVar5 = s->vLearnts;
    puVar10 = puVar10 + 1;
  }
  pVVar5 = s->vClauses;
  puVar10 = (uint *)pVVar5->pArray;
  for (lVar8 = 0; pxVar1 = s->pMemory, lVar8 < pVVar5->nSize; lVar8 = lVar8 + 1) {
    xSAT_SolverClaRealloc(p,pxVar1,puVar10);
    pVVar5 = s->vClauses;
    puVar10 = puVar10 + 1;
  }
  free(pxVar1->pData);
  free(pxVar1);
  s->pMemory = p;
  return;
}

Assistant:

void xSAT_SolverGarbageCollect( xSAT_Solver_t * s )
{
    int i;
    unsigned * pArray;
    xSAT_Mem_t * pNewMemMngr = xSAT_MemAlloc(  xSAT_MemCap( s->pMemory ) - xSAT_MemWastedCap( s->pMemory ) );

    for ( i = 0; i < 2 * Vec_StrSize( s->vAssigns ); i++ )
    {
        xSAT_WatchList_t* ws = xSAT_VecWatchListEntry( s->vWatches, i);
        xSAT_Watcher_t* begin = xSAT_WatchListArray(ws);
        xSAT_Watcher_t* end   = begin + xSAT_WatchListSize(ws);
        xSAT_Watcher_t *w;

        for ( w = begin; w != end; w++ )
            xSAT_SolverClaRealloc( pNewMemMngr, s->pMemory, &(w->CRef) );

        ws = xSAT_VecWatchListEntry( s->vBinWatches, i);
        begin = xSAT_WatchListArray(ws);
        end   = begin + xSAT_WatchListSize(ws);
        for ( w = begin; w != end; w++ )
            xSAT_SolverClaRealloc( pNewMemMngr, s->pMemory, &(w->CRef) );
    }

    for ( i = 0; i < Vec_IntSize( s->vTrail ); i++ )
        if ( ( unsigned ) Vec_IntEntry( s->vReasons, xSAT_Lit2Var( Vec_IntEntry( s->vTrail, i ) ) ) != CRefUndef )
            xSAT_SolverClaRealloc( pNewMemMngr, s->pMemory, ( unsigned * ) &( Vec_IntArray( s->vReasons )[xSAT_Lit2Var( Vec_IntEntry( s->vTrail, i ) )] ) );

    pArray = ( unsigned * ) Vec_IntArray( s->vLearnts );
    for ( i = 0; i < Vec_IntSize( s->vLearnts ); i++ )
        xSAT_SolverClaRealloc( pNewMemMngr, s->pMemory, &(pArray[i]) );

    pArray = ( unsigned * ) Vec_IntArray( s->vClauses );
    for ( i = 0; i < Vec_IntSize( s->vClauses ); i++ )
        xSAT_SolverClaRealloc( pNewMemMngr, s->pMemory, &(pArray[i]) );

    xSAT_MemFree( s->pMemory );
    s->pMemory = pNewMemMngr;
}